

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-wilderness.c
# Opt level: O1

void mtn_connect(chunk_conflict *c,loc_conflict grid1,loc_conflict grid2)

{
  _Bool _Var1;
  wchar_t wVar2;
  feature *pfVar3;
  ulong uVar4;
  loc_conflict gp [512];
  loc local_1028 [513];
  
  wVar2 = project_path((chunk *)c,local_1028,L'Ȁ',(loc)grid1,(loc)grid2,L'耀');
  if (L'\0' < wVar2) {
    uVar4 = 0;
    do {
      _Var1 = square_in_bounds_fully(c,local_1028[uVar4]);
      if (!_Var1) {
        return;
      }
      pfVar3 = square_feat(c,local_1028[uVar4]);
      if (pfVar3->fidx == FEAT_ROAD) {
        return;
      }
      _Var1 = square_ismark(c,local_1028[uVar4]);
      if (_Var1) {
        return;
      }
      square_set_feat(c,local_1028[uVar4],FEAT_ROAD);
      square_mark(c,local_1028[uVar4]);
      uVar4 = uVar4 + 1;
    } while ((uint)wVar2 != uVar4);
  }
  return;
}

Assistant:

static void mtn_connect(struct chunk *c, struct loc grid1, struct loc grid2)
{
	struct loc gp[512];
	int path_grids, j;

	/* Find the shortest path */
	path_grids = project_path(c, gp, 512, grid1, grid2, PROJECT_ROCK);

	/* Make the path */
	for (j = 0; j < path_grids; j++) {
		if (!square_in_bounds_fully(c, gp[j])
				|| square_feat(c, gp[j])->fidx == FEAT_ROAD
				|| square_ismark(c, gp[j]))
			break;
		square_set_feat(c, gp[j], FEAT_ROAD);
		square_mark(c, gp[j]);
	}
}